

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

void __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::FunctionBody_const,Js::ScriptContext::RejitStats*,DefaultComparer<Js::FunctionBody_const*>,true>
::Map<Js::ScriptContext::PrintStats()::__3>
          (WeaklyReferencedKeyDictionary<Js::FunctionBody_const,Js::ScriptContext::RejitStats*,DefaultComparer<Js::FunctionBody_const*>,true>
           *this)

{
  int iVar1;
  WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
  *pWVar2;
  RejitStats *stats;
  int **ppiVar3;
  WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
  **ppWVar4;
  RecyclerWeakReference<const_Js::FunctionBody> *this_00;
  FunctionBody *body;
  RejitStats **ppRVar5;
  RecyclerWeakReference<const_Js::FunctionBody> **ppRVar6;
  int nextIndex;
  FunctionBody *key;
  EntryType *currentEntry;
  int local_20;
  int currentIndex;
  int previousIndex;
  int i;
  WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
  *this_local;
  
  for (currentIndex = 0; currentIndex < *(int *)this; currentIndex = currentIndex + 1) {
    ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)(this + 8));
    if ((*ppiVar3)[currentIndex] != -1) {
      local_20 = -1;
      ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)(this + 8));
      currentEntry._4_4_ = (*ppiVar3)[currentIndex];
      while (currentEntry._4_4_ != -1) {
        ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                            ((WriteBarrierPtr *)(this + 0x10));
        pWVar2 = *ppWVar4;
        this_00 = Memory::
                  WriteBarrierPtr<const_Memory::RecyclerWeakReference<const_Js::FunctionBody>_>::
                  operator->(&pWVar2[currentEntry._4_4_].key);
        body = Memory::RecyclerWeakReference<const_Js::FunctionBody>::Get(this_00);
        if (body == (FunctionBody *)0x0) {
          iVar1 = pWVar2[currentEntry._4_4_].next;
          WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
          ::RemoveEntry((WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
                         *)this,currentEntry._4_4_,local_20,currentIndex);
          currentEntry._4_4_ = iVar1;
        }
        else {
          ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_RejitStats__
                              ((WriteBarrierPtr *)&pWVar2[currentEntry._4_4_].value);
          stats = *ppRVar5;
          ppRVar6 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                              ((WriteBarrierPtr *)&pWVar2[currentEntry._4_4_].key);
          Js::ScriptContext::PrintStats::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)((long)&this_local + 7),body,stats,*ppRVar6);
          local_20 = currentEntry._4_4_;
          currentEntry._4_4_ = pWVar2[currentEntry._4_4_].next;
        }
      }
    }
  }
  return;
}

Assistant:

void Map(Fn fn)
        {
            for(int i = 0; i < size; i++)
            {
                if(buckets[i] != -1)
                {
                    for(int previousIndex = -1, currentIndex = buckets[i]; currentIndex != -1;)
                    {
                        EntryType &currentEntry = entries[currentIndex];
                        TKey * key = currentEntry.key->Get();
                        if(key != nullptr)
                        {
                            fn(key, currentEntry.value, currentEntry.key);

                            // Keep the entry
                            previousIndex = currentIndex;
                            currentIndex = currentEntry.next;
                        }
                        else
                        {
                            // Remove the entry
                            const int nextIndex = currentEntry.next;
                            RemoveEntry(currentIndex, previousIndex, i);
                            currentIndex = nextIndex;
                        }
                    }
                }
            }
        }